

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  void *pvVar4;
  U64 UVar5;
  ulong *in_RDI;
  int nbBytes;
  int nbBits;
  int ctz;
  HUF_DEltX2 entry_2;
  int index_2;
  HUF_DEltX2 entry_1;
  int index_1;
  HUF_DEltX2 entry;
  int index;
  size_t oiters;
  size_t iters;
  int symbol;
  int stream;
  BYTE *olimit;
  BYTE *ilimit;
  HUF_DEltX2 *dtable;
  BYTE *oend [4];
  BYTE *op [4];
  BYTE *ip [4];
  U64 bits [4];
  ulong local_e8;
  U16 local_d0;
  byte bStack_ce;
  U16 local_c8;
  byte bStack_c6;
  U16 local_c0;
  byte bStack_be;
  ulong local_b0;
  int local_a8;
  int local_a4;
  ulong local_88 [2];
  void *local_78;
  ulong local_70;
  ulong local_68 [3];
  void *local_50;
  ulong local_48 [4];
  ulong local_28 [4];
  ulong *local_8;
  
  uVar1 = in_RDI[0xc];
  uVar2 = in_RDI[0xd];
  local_28[0] = in_RDI[8];
  local_28[1] = in_RDI[9];
  local_28[2] = in_RDI[10];
  local_28[3] = in_RDI[0xb];
  local_48[0] = *in_RDI;
  local_48[1] = in_RDI[1];
  local_48[2] = in_RDI[2];
  local_48[3] = in_RDI[3];
  local_68[0] = in_RDI[4];
  local_88[0] = in_RDI[5];
  local_88[1] = in_RDI[6];
  local_78 = (void *)in_RDI[7];
  local_70 = in_RDI[0xe];
  local_68[1] = local_88[0];
  local_68[2] = local_88[1];
  local_50 = local_78;
  local_8 = in_RDI;
  uVar3 = MEM_isLittleEndian();
  if (uVar3 == 0) {
    __assert_fail("MEM_isLittleEndian()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9205,
                  "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  uVar3 = MEM_32bits();
  if (uVar3 != 0) {
    __assert_fail("!MEM_32bits()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9206,
                  "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  while( true ) {
    for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
      if (local_88[local_a4] < local_68[local_a4]) {
        __assert_fail("op[stream] <= oend[stream]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9210,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (local_48[local_a4] < uVar2) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9211,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    local_b0 = (local_48[0] - uVar2) / 7;
    for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
      local_e8 = (local_88[local_a4] - local_68[local_a4]) / 10;
      if (local_b0 < local_e8) {
        local_e8 = local_b0;
      }
      local_b0 = local_e8;
    }
    pvVar4 = (void *)((long)local_50 + local_b0 * 5);
    if (pvVar4 < (void *)((long)local_50 + 10U)) break;
    for (local_a4 = 1; local_a4 < 4; local_a4 = local_a4 + 1) {
      if (local_48[local_a4] < local_48[local_a4 + -1]) goto LAB_00408a8a;
    }
    for (local_a4 = 1; local_a4 < 4; local_a4 = local_a4 + 1) {
      if (local_48[local_a4] < local_48[local_a4 + -1]) {
        __assert_fail("ip[stream] >= ip[stream - 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9240,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    do {
      for (local_a8 = 0; local_a8 < 5; local_a8 = local_a8 + 1) {
        for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
          uVar3 = *(uint *)(uVar1 + (long)(int)(uint)(local_28[local_a4] >> 0x35) * 4);
          local_c0 = (U16)uVar3;
          MEM_write16((void *)local_68[local_a4],local_c0);
          bStack_be = (byte)(uVar3 >> 0x10);
          local_28[local_a4] = local_28[local_a4] << (bStack_be & 0x3f);
          local_68[local_a4] = local_68[local_a4] + (long)(int)(uVar3 >> 0x18);
        }
      }
      uVar3 = *(uint *)(uVar1 + (long)(int)(uint)(local_28[3] >> 0x35) * 4);
      local_c8 = (U16)uVar3;
      MEM_write16(local_50,local_c8);
      bStack_c6 = (byte)(uVar3 >> 0x10);
      local_28[3] = local_28[3] << (bStack_c6 & 0x3f);
      local_50 = (void *)((long)local_50 + (long)(int)(uVar3 >> 0x18));
      for (local_a4 = 0; local_a4 < 4; local_a4 = local_a4 + 1) {
        uVar3 = *(uint *)(uVar1 + (long)(int)(uint)(local_28[3] >> 0x35) * 4);
        local_d0 = (U16)uVar3;
        MEM_write16(local_50,local_d0);
        bStack_ce = (byte)(uVar3 >> 0x10);
        local_28[3] = local_28[3] << (bStack_ce & 0x3f);
        local_50 = (void *)((long)local_50 + (long)(int)(uVar3 >> 0x18));
        uVar3 = ZSTD_countTrailingZeros64(local_28[local_a4]);
        local_48[local_a4] = local_48[local_a4] - (long)((int)uVar3 >> 3);
        UVar5 = MEM_read64((void *)local_48[local_a4]);
        local_28[local_a4] = UVar5 | 1;
        local_28[local_a4] = local_28[local_a4] << ((byte)uVar3 & 7);
      }
    } while (local_50 < pvVar4);
  }
LAB_00408a8a:
  local_8[8] = local_28[0];
  local_8[9] = local_28[1];
  local_8[10] = local_28[2];
  local_8[0xb] = local_28[3];
  *local_8 = local_48[0];
  local_8[1] = local_48[1];
  local_8[2] = local_48[2];
  local_8[3] = local_48[3];
  local_8[4] = local_68[0];
  local_8[5] = local_68[1];
  local_8[6] = local_68[2];
  local_8[7] = (ulong)local_50;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilimit) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop if we are too close to the end. */
            if (op[3] + 10 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Do 5 table lookups for each of the first 3 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 3; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[stream], entry.sequence);
                    bits[stream] <<= (entry.nbBits);
                    op[stream] += (entry.length);
                }
            }
            /* Do 1 table lookup from the final stream */
            {
                int const index = (int)(bits[3] >> 53);
                HUF_DEltX2 const entry = dtable[index];
                MEM_write16(op[3], entry.sequence);
                bits[3] <<= (entry.nbBits);
                op[3] += (entry.length);
            }
            /* Do 4 table lookups from the final stream & reload bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                /* Do a table lookup from the final stream.
                 * This is interleaved with the reloading to reduce register
                 * pressure. This shouldn't be necessary, but compilers can
                 * struggle with codegen with high register pressure.
                 */
                {
                    int const index = (int)(bits[3] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[3], entry.sequence);
                    bits[3] <<= (entry.nbBits);
                    op[3] += (entry.length);
                }
                /* Reload the bistreams. The final bitstream must be reloaded
                 * after the 5th symbol was decoded.
                 */
                {
                    int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                    int const nbBits = ctz & 7;
                    int const nbBytes = ctz >> 3;
                    ip[stream] -= nbBytes;
                    bits[stream] = MEM_read64(ip[stream]) | 1;
                    bits[stream] <<= nbBits;
                }
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}